

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O0

void __thiscall Assimp::ASE::Parser::ParseLV2AnimationBlock(Parser *this,BaseNode *mesh)

{
  bool bVar1;
  long lVar2;
  Logger *pLVar3;
  undefined1 local_48 [8];
  string temp;
  Animation *anim;
  int iDepth;
  BaseNode *mesh_local;
  Parser *this_local;
  
  anim._4_4_ = 0;
  temp.field_2._8_8_ = &mesh->mAnim;
LAB_0049244d:
  do {
    if (*this->filePtr == '*') {
      this->filePtr = this->filePtr + 1;
      bVar1 = TokenMatch<char_const>(&this->filePtr,"NODE_NAME",9);
      if (bVar1) {
        std::__cxx11::string::string((string *)local_48);
        bVar1 = ParseString(this,(string *)local_48,"*NODE_NAME");
        if (!bVar1) {
          SkipToNextToken(this);
        }
        lVar2 = std::__cxx11::string::find(local_48,0xa85e1c);
        if (lVar2 != -1) {
          if (((mesh->mType == Camera) && (*(int *)&mesh[1].mName == 1)) ||
             ((mesh->mType == Light && (*(int *)&mesh->field_0x154 == 1)))) {
            temp.field_2._8_8_ = &mesh->mTargetAnim;
          }
          else {
            pLVar3 = DefaultLogger::get();
            Logger::error(pLVar3,
                          "ASE: Found target animation channel but the node is neither a camera nor a spot light"
                         );
            temp.field_2._8_8_ = 0;
          }
        }
        std::__cxx11::string::~string((string *)local_48);
        goto LAB_0049244d;
      }
      bVar1 = TokenMatch<char_const>(&this->filePtr,"CONTROL_POS_TRACK",0x11);
      if (((bVar1) ||
          (bVar1 = TokenMatch<char_const>(&this->filePtr,"CONTROL_POS_BEZIER",0x12), bVar1)) ||
         (bVar1 = TokenMatch<char_const>(&this->filePtr,"CONTROL_POS_TCB",0xf), bVar1)) {
        if (temp.field_2._8_8_ == 0) {
          SkipSection(this);
        }
        else {
          ParseLV3PosAnimationBlock(this,(Animation *)temp.field_2._8_8_);
        }
        goto LAB_0049244d;
      }
      bVar1 = TokenMatch<char_const>(&this->filePtr,"CONTROL_SCALE_TRACK",0x13);
      if (((bVar1) ||
          (bVar1 = TokenMatch<char_const>(&this->filePtr,"CONTROL_SCALE_BEZIER",0x14), bVar1)) ||
         (bVar1 = TokenMatch<char_const>(&this->filePtr,"CONTROL_SCALE_TCB",0x11), bVar1)) {
        if ((temp.field_2._8_8_ == 0) || ((Animation *)temp.field_2._8_8_ == &mesh->mTargetAnim)) {
          pLVar3 = DefaultLogger::get();
          Logger::error(pLVar3,"ASE: Ignoring scaling channel in target animation");
          SkipSection(this);
        }
        else {
          ParseLV3ScaleAnimationBlock(this,(Animation *)temp.field_2._8_8_);
        }
        goto LAB_0049244d;
      }
      bVar1 = TokenMatch<char_const>(&this->filePtr,"CONTROL_ROT_TRACK",0x11);
      if (((bVar1) ||
          (bVar1 = TokenMatch<char_const>(&this->filePtr,"CONTROL_ROT_BEZIER",0x12), bVar1)) ||
         (bVar1 = TokenMatch<char_const>(&this->filePtr,"CONTROL_ROT_TCB",0xf), bVar1)) {
        if ((temp.field_2._8_8_ == 0) || ((Animation *)temp.field_2._8_8_ == &mesh->mTargetAnim)) {
          pLVar3 = DefaultLogger::get();
          Logger::error(pLVar3,"ASE: Ignoring rotation channel in target animation");
          SkipSection(this);
        }
        else {
          ParseLV3RotAnimationBlock(this,(Animation *)temp.field_2._8_8_);
        }
        goto LAB_0049244d;
      }
    }
    if (*this->filePtr == '{') {
      anim._4_4_ = anim._4_4_ + 1;
    }
    else if (*this->filePtr == '}') {
      anim._4_4_ = anim._4_4_ + -1;
      if (anim._4_4_ == 0) {
        this->filePtr = this->filePtr + 1;
        SkipToNextToken(this);
        return;
      }
    }
    else if (*this->filePtr == '\0') {
      LogError(this,"Encountered unexpected EOL while parsing a TM_ANIMATION chunk (Level 2)");
    }
    bVar1 = IsLineEnd<char>(*this->filePtr);
    if ((bVar1) && ((this->bLastWasEndLine & 1U) == 0)) {
      this->iLineNumber = this->iLineNumber + 1;
      this->bLastWasEndLine = true;
    }
    else {
      this->bLastWasEndLine = false;
    }
    this->filePtr = this->filePtr + 1;
  } while( true );
}

Assistant:

void Parser::ParseLV2AnimationBlock(ASE::BaseNode& mesh)
{
    AI_ASE_PARSER_INIT();

    ASE::Animation* anim = &mesh.mAnim;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            if (TokenMatch(filePtr,"NODE_NAME" ,9))
            {
                std::string temp;
                if(!ParseString(temp,"*NODE_NAME"))
                    SkipToNextToken();

                // If the name of the node contains .target it
                // represents an animated camera or spot light
                // target.
                if (std::string::npos != temp.find(".Target"))
                {
                    if  ((mesh.mType != BaseNode::Camera || ((ASE::Camera&)mesh).mCameraType != ASE::Camera::TARGET)  &&
                        ( mesh.mType != BaseNode::Light  || ((ASE::Light&)mesh).mLightType   != ASE::Light::TARGET))
                    {

                        ASSIMP_LOG_ERROR("ASE: Found target animation channel "
                            "but the node is neither a camera nor a spot light");
                        anim = NULL;
                    }
                    else anim = &mesh.mTargetAnim;
                }
                continue;
            }

            // position keyframes
            if (TokenMatch(filePtr,"CONTROL_POS_TRACK"  ,17)  ||
                TokenMatch(filePtr,"CONTROL_POS_BEZIER" ,18)  ||
                TokenMatch(filePtr,"CONTROL_POS_TCB"    ,15))
            {
                if (!anim)SkipSection();
                else ParseLV3PosAnimationBlock(*anim);
                continue;
            }
            // scaling keyframes
            if (TokenMatch(filePtr,"CONTROL_SCALE_TRACK"  ,19) ||
                TokenMatch(filePtr,"CONTROL_SCALE_BEZIER" ,20) ||
                TokenMatch(filePtr,"CONTROL_SCALE_TCB"    ,17))
            {
                if (!anim || anim == &mesh.mTargetAnim)
                {
                    // Target animation channels may have no rotation channels
                    ASSIMP_LOG_ERROR("ASE: Ignoring scaling channel in target animation");
                    SkipSection();
                }
                else ParseLV3ScaleAnimationBlock(*anim);
                continue;
            }
            // rotation keyframes
            if (TokenMatch(filePtr,"CONTROL_ROT_TRACK"  ,17) ||
                TokenMatch(filePtr,"CONTROL_ROT_BEZIER" ,18) ||
                TokenMatch(filePtr,"CONTROL_ROT_TCB"    ,15))
            {
                if (!anim || anim == &mesh.mTargetAnim)
                {
                    // Target animation channels may have no rotation channels
                    ASSIMP_LOG_ERROR("ASE: Ignoring rotation channel in target animation");
                    SkipSection();
                }
                else ParseLV3RotAnimationBlock(*anim);
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("2","TM_ANIMATION");
    }
}